

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O1

bool __thiscall
ON_ModelComponent::Internal_SetAsSystemComponent(ON_ModelComponent *this,bool bUnsetSystemComponent)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ON_NameHash *this_00;
  
  if (this->m_locked_status == 0xffff) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,0x30f,"","component is already a system component.");
LAB_00539ff6:
    bVar1 = true;
  }
  else {
    bVar2 = this->m_component_type - Image;
    if (bVar2 < 0x11) {
      bVar2 = (byte)(0x1800 >> (bVar2 & 0x1f));
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0x7c4,"","Invalid component_type parameter.");
      bVar2 = 1;
    }
    bVar3 = this->m_component_type - Image;
    if ((bVar3 < 0x11) && ((0x17fffU >> (bVar3 & 0x1f) & 1) != 0)) {
      bVar3 = (byte)(0x3907 >> (bVar3 & 0x1f));
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0x807,"","Invalid component_type parameter.");
      bVar3 = 1;
    }
    bVar4 = this->m_component_type - Image;
    if ((bVar4 < 0x11) && ((0x17fffU >> (bVar4 & 0x1f) & 1) != 0)) {
      bVar4 = (byte)(0x8010 >> (bVar4 & 0x1f));
    }
    else {
      bVar4 = 0;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0x7e5,"","Invalid component_type parameter.");
    }
    bVar1 = ::operator==(&ON_nil_uuid,&this->m_component_parent_id);
    if (((bVar1) && (((bVar4 ^ (byte)this->m_set_status >> 6) & 1) == 0)) &&
       (bVar1 = ::operator==(&ON_nil_uuid,&this->m_component_id), bVar1 == bUnsetSystemComponent)) {
      if (((bVar2 | bUnsetSystemComponent) & 1) == 0) {
        if (((this->m_set_status & 0x10) != 0) && (0x80000001 < (uint)this->m_component_index))
        goto LAB_0053a133;
      }
      else if ((this->m_set_status & 0x10) == 0) {
LAB_0053a133:
        bVar1 = ON_ComponentStatus::operator!=(&this->m_component_status,this->m_component_status);
        if (!bVar1) {
          if (((bVar3 | bUnsetSystemComponent) & 1) == 0) {
            if (((this->m_set_status & 0x20) == 0) ||
               (bVar1 = ON_wString::IsNotEmpty(&this->m_component_name), !bVar1)) goto LAB_0053a0e5;
            if ((this->m_set_status & 0x20) == 0) {
              this_00 = &ON_NameHash::EmptyNameHash;
            }
            else {
              this_00 = Internal_NameHash(this);
            }
            bVar1 = ON_NameHash::IsValidAndNotEmpty(this_00);
          }
          else {
            if ((this->m_set_status & 0x20) != 0) {
              return false;
            }
            bVar1 = ON_NameHash::IsEmptyNameHash(&ON_NameHash::EmptyNameHash);
          }
          if (bVar1 != false) {
            this->m_locked_status = 0xffff;
            this->m_content_version_number = 0;
            goto LAB_00539ff6;
          }
        }
      }
    }
LAB_0053a0e5:
    bVar1 = false;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,0x350,"","Invalid settings for a system component.");
  }
  return bVar1;
}

Assistant:

bool ON_ModelComponent::Internal_SetAsSystemComponent(
  bool bUnsetSystemComponent
  )
{
  if (m_locked_status == 0xFFFFU)
  {
    ON_ERROR("component is already a system component.");
    return true;
  }

  const bool bIndexRequired = ON_ModelComponent::IndexRequired(m_component_type);
  const bool bUniqueNameRequired = ON_ModelComponent::UniqueNameRequired(m_component_type);
  const bool bUniqueNameIncludesParent = ON_ModelComponent::UniqueNameIncludesParent(m_component_type);

  for (;;)
  {
    if (ParentIdIsNotNil())
      break;

    if (bUniqueNameIncludesParent != ParentIdIsSet())
      break;
    
    if (IdIsNil())
    {
      if (!bUnsetSystemComponent)
        break;
    }
    else
    {
      if (bUnsetSystemComponent)
        break;
    }
    
    if ( bIndexRequired && false == bUnsetSystemComponent )
    {
      if (false == IndexIsSet())
        break;
      if (Index() >= 0)
        break;
      if (Index() <= ON_UNSET_INT_INDEX)
        break;
    }
    else
    {
      if (IndexIsSet())
        break;
    }
    
    if ( ON_ModelComponent::m_component_status != m_component_status ) 
      break;

    if (bUniqueNameRequired && false == bUnsetSystemComponent)
    {
      if (false == NameIsNotEmpty())
        break;
      if (false == NameHash().IsValidAndNotEmpty())
        break;
    }
    else
    {
      if (NameIsSet())
        return false;
      if (false == NameHash().IsEmptyNameHash())
        break;
    }

    m_locked_status = 0xFFFFU;
    m_content_version_number = 0;
    return true;
  }

  ON_ERROR("Invalid settings for a system component.");
  return false;
}